

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O1

void VP8LOptimizeSampling
               (uint32_t *image,int full_width,int full_height,int bits,int max_bits,
               int *best_bits_out)

{
  long lVar1;
  uint32_t *puVar2;
  size_t __n;
  int iVar3;
  int iVar4;
  byte bVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  uint32_t *puVar9;
  ulong uVar10;
  uint uVar11;
  uint32_t *puVar12;
  long lVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  
  bVar5 = (byte)bits;
  iVar3 = 1 << (bVar5 & 0x1f);
  uVar20 = (iVar3 + full_width) - 1;
  uVar21 = uVar20 >> (bVar5 & 0x1f);
  uVar11 = (iVar3 + full_height) - 1U >> (bVar5 & 0x1f);
  *best_bits_out = bits;
  lVar24 = (long)(int)uVar21;
  __n = lVar24 * 4;
  iVar3 = bits;
  do {
    iVar16 = iVar3;
    if (max_bits <= iVar3) break;
    iVar4 = 1 << ((char)iVar3 - bVar5 & 0x1f);
    iVar15 = iVar3 + 1;
    bVar14 = iVar4 < (int)uVar11;
    iVar16 = iVar15;
    if (iVar4 < (int)uVar11) {
      lVar8 = (long)iVar4;
      iVar4 = bcmp(image,image + lVar8 * lVar24,__n);
      iVar16 = iVar3;
      if (iVar4 == 0) {
        lVar13 = (long)(1 << ((char)iVar15 - bVar5 & 0x1f));
        lVar6 = (int)uVar11 - lVar8;
        lVar7 = __n * lVar13;
        lVar19 = 0;
        puVar9 = (uint32_t *)((lVar8 + lVar13) * __n + (long)image);
        puVar12 = (uint32_t *)((long)image + lVar7);
        do {
          lVar19 = lVar19 + lVar13;
          bVar14 = lVar19 < lVar6;
          iVar16 = iVar15;
          if (lVar6 <= lVar19) break;
          iVar4 = bcmp(puVar12,puVar9,__n);
          puVar9 = (uint32_t *)((long)puVar9 + lVar7);
          puVar12 = (uint32_t *)((long)puVar12 + lVar7);
          iVar16 = iVar3;
        } while (iVar4 == 0);
      }
    }
    iVar3 = iVar16;
  } while (!bVar14);
  if (iVar16 != bits) {
    iVar3 = bits;
    if (iVar16 < bits) {
      iVar3 = iVar16;
    }
    do {
      iVar4 = iVar3;
      if (iVar16 - bits == 0 || iVar16 < bits) break;
      if ((int)uVar11 < 1) {
        bVar14 = true;
      }
      else {
        lVar8 = (long)(1 << ((byte)(iVar16 - bits) & 0x1f));
        lVar13 = 0;
        puVar9 = image;
        do {
          if ((int)(uVar20 >> (bVar5 & 0x1f)) < 1) {
            bVar14 = true;
          }
          else {
            lVar6 = 0;
            puVar12 = puVar9;
            do {
              lVar7 = lVar6 + lVar8;
              uVar23 = uVar21;
              if ((int)(uint)lVar7 < (int)uVar21) {
                uVar23 = (uint)lVar7;
              }
              lVar22 = (long)(int)uVar23;
              lVar19 = 1;
              do {
                lVar1 = lVar6 + lVar19;
                bVar14 = lVar22 <= lVar1;
                if (lVar22 <= lVar1) break;
                puVar2 = puVar12 + lVar19;
                lVar19 = lVar19 + 1;
              } while (*puVar2 == image[lVar13 * lVar24 + lVar6]);
            } while ((lVar22 <= lVar1) && (puVar12 = puVar12 + lVar8, lVar6 = lVar7, lVar7 < lVar24)
                    );
          }
          if (bVar14 == false) break;
          lVar13 = lVar13 + 1;
          puVar9 = puVar9 + lVar24;
        } while (lVar13 < (int)uVar11);
      }
      iVar16 = iVar16 - (uint)(bVar14 ^ 1U);
      iVar4 = iVar16;
    } while ((bVar14 ^ 1U) != 0);
    if (iVar4 - bits != 0) {
      bVar5 = (byte)iVar4;
      iVar3 = 1 << (bVar5 & 0x1f);
      uVar20 = full_width + -1 + iVar3;
      uVar23 = uVar20 >> (bVar5 & 0x1f);
      uVar11 = iVar3 + full_height + -1;
      if (0 < (int)(uVar11 >> (bVar5 & 0x1f))) {
        iVar3 = 0;
        uVar17 = 0;
        uVar18 = 0;
        do {
          if (0 < (int)(uVar20 >> (bVar5 & 0x1f))) {
            uVar10 = 0;
            do {
              image[uVar17 + uVar10] = image[iVar3 + (int)uVar10 << ((byte)(iVar4 - bits) & 0x1f)];
              uVar10 = uVar10 + 1;
            } while (uVar23 != uVar10);
          }
          uVar18 = uVar18 + 1;
          uVar17 = uVar17 + uVar23;
          iVar3 = iVar3 + uVar21;
        } while (uVar18 != uVar11 >> (bVar5 & 0x1f));
      }
      *best_bits_out = iVar4;
    }
  }
  return;
}

Assistant:

void VP8LOptimizeSampling(uint32_t* const image, int full_width,
                          int full_height, int bits, int max_bits,
                          int* best_bits_out) {
  int width = VP8LSubSampleSize(full_width, bits);
  int height = VP8LSubSampleSize(full_height, bits);
  int old_width, x, y, square_size;
  int best_bits = bits;
  *best_bits_out = bits;
  // Check rows first.
  while (best_bits < max_bits) {
    const int new_square_size = 1 << (best_bits + 1 - bits);
    int is_good = 1;
    square_size = 1 << (best_bits - bits);
    for (y = 0; y + square_size < height; y += new_square_size) {
      // Check the first lines of consecutive line groups.
      if (memcmp(&image[y * width], &image[(y + square_size) * width],
                 width * sizeof(*image)) != 0) {
        is_good = 0;
        break;
      }
    }
    if (is_good) {
      ++best_bits;
    } else {
      break;
    }
  }
  if (best_bits == bits) return;

  // Check columns.
  while (best_bits > bits) {
    int is_good = 1;
    square_size = 1 << (best_bits - bits);
    for (y = 0; is_good && y < height; ++y) {
      for (x = 0; is_good && x < width; x += square_size) {
        int i;
        for (i = x + 1; i < GetMin(x + square_size, width); ++i) {
          if (image[y * width + i] != image[y * width + x]) {
            is_good = 0;
            break;
          }
        }
      }
    }
    if (is_good) {
      break;
    }
    --best_bits;
  }
  if (best_bits == bits) return;

  // Subsample the image.
  old_width = width;
  square_size = 1 << (best_bits - bits);
  width = VP8LSubSampleSize(full_width, best_bits);
  height = VP8LSubSampleSize(full_height, best_bits);
  for (y = 0; y < height; ++y) {
    for (x = 0; x < width; ++x) {
      image[y * width + x] = image[square_size * (y * old_width + x)];
    }
  }
  *best_bits_out = best_bits;
}